

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_v128.h
# Opt level: O2

v256 * v256_unziplo_8(v256 a,v256 b)

{
  v256 *in_RDI;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar4 = ZEXT816(0xe0c0a0806040200);
  auVar1 = pshufb((undefined1  [16])a.val[0],auVar4);
  auVar2 = pshufb((undefined1  [16])a.val[1],auVar4);
  auVar3 = pshufb((undefined1  [16])b.val[0],auVar4);
  auVar4 = pshufb((undefined1  [16])b.val[1],auVar4);
  in_RDI->val[1][0] = auVar1._0_8_;
  in_RDI->val[1][1] = auVar2._0_8_;
  in_RDI->val[0][0] = auVar3._0_8_;
  in_RDI->val[0][1] = auVar4._0_8_;
  return in_RDI;
}

Assistant:

SIMD_INLINE v256 v256_unziplo_8(v256 a, v256 b) {
  return v256_from_v128(v128_unziplo_8(a.val[1], a.val[0]),
                        v128_unziplo_8(b.val[1], b.val[0]));
}